

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O2

void duckdb::StringDecompressFunction<unsigned_char>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  data_t dVar2;
  idx_t count;
  ulong *puVar3;
  unsigned_long *puVar4;
  long lVar5;
  string_t *psVar6;
  uchar *puVar7;
  optional_idx oVar8;
  byte bVar9;
  uint uVar10;
  FunctionLocalState *pFVar11;
  reference vector;
  Vector *vector_00;
  idx_t iVar12;
  SelectionVector *sel;
  void *in_R9;
  data_ptr_t pdVar13;
  idx_t iVar14;
  undefined1 in_stack_ffffffffffffff78;
  optional_idx dict_size;
  data_ptr_t local_70;
  unsigned_long *local_68;
  
  dict_size.index = (idx_t)state[1]._vptr_ExpressionState;
  pFVar11 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                      ((optional_ptr<duckdb::FunctionLocalState,_true> *)&dict_size);
  ArenaAllocator::Reset((ArenaAllocator *)(pFVar11 + 1));
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  VVar1 = vector->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar6 = (string_t *)result->data;
    puVar7 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_char,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_char>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_char_const&)_1_>
              (puVar7,psVar6,count,&vector->validity,&result->validity,in_R9,
               (bool)in_stack_ffffffffffffff78);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      dict_size = DictionaryVector::DictionarySize(vector);
      if (((dict_size.index != 0xffffffffffffffff) &&
          (iVar14 = optional_idx::GetIndex(&dict_size), iVar14 * 2 <= count)) &&
         (vector_00 = DictionaryVector::Child(vector), vector_00->vector_type == FLAT_VECTOR)) {
        psVar6 = (string_t *)result->data;
        puVar7 = vector_00->data;
        iVar14 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        UnaryExecutor::
        ExecuteFlat<unsigned_char,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_char>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_char_const&)_1_>
                  (puVar7,psVar6,iVar14,&vector_00->validity,&result->validity,in_R9,
                   (bool)in_stack_ffffffffffffff78);
        sel = DictionaryVector::SelVector(vector);
        iVar14 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar14,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar3 = (ulong *)result->data;
      pdVar13 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      dVar2 = *pdVar13;
      uVar10 = (uint)(byte)(dVar2 - 1);
      if (dVar2 == '\0') {
        uVar10 = 0;
      }
      *puVar3 = (ulong)(dVar2 != '\0') | (ulong)uVar10 << 0x20;
      puVar3[1] = 0;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(vector,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    oVar8 = dict_size;
    pdVar13 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == (unsigned_long *)0x0) {
      pdVar13 = pdVar13 + 8;
      for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
        lVar5 = *(long *)oVar8.index;
        iVar12 = iVar14;
        if (lVar5 != 0) {
          iVar12 = (idx_t)*(uint *)(lVar5 + iVar14 * 4);
        }
        dVar2 = local_70[iVar12];
        uVar10 = (uint)(byte)(dVar2 - 1);
        if (dVar2 == '\0') {
          uVar10 = 0;
        }
        *(ulong *)(pdVar13 + -8) = (ulong)(dVar2 != '\0') | (ulong)uVar10 << 0x20;
        pdVar13[0] = '\0';
        pdVar13[1] = '\0';
        pdVar13[2] = '\0';
        pdVar13[3] = '\0';
        pdVar13[4] = '\0';
        pdVar13[5] = '\0';
        pdVar13[6] = '\0';
        pdVar13[7] = '\0';
        pdVar13 = pdVar13 + 0x10;
      }
    }
    else {
      pdVar13 = pdVar13 + 8;
      for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
        lVar5 = *(long *)oVar8.index;
        iVar12 = iVar14;
        if (lVar5 != 0) {
          iVar12 = (idx_t)*(uint *)(lVar5 + iVar14 * 4);
        }
        if ((local_68[iVar12 >> 6] >> (iVar12 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar14);
        }
        else {
          dVar2 = local_70[iVar12];
          bVar9 = dVar2 - 1;
          if (dVar2 == '\0') {
            bVar9 = 0;
          }
          *(ulong *)(pdVar13 + -8) = (ulong)(dVar2 != '\0') | (ulong)bVar9 << 0x20;
          pdVar13[0] = '\0';
          pdVar13[1] = '\0';
          pdVar13[2] = '\0';
          pdVar13[3] = '\0';
          pdVar13[4] = '\0';
          pdVar13[5] = '\0';
          pdVar13[6] = '\0';
          pdVar13[7] = '\0';
        }
        pdVar13 = pdVar13 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static void StringDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &allocator = ExecuteFunctionState::GetFunctionState(state)->Cast<StringDecompressLocalState>().allocator;
	allocator.Reset();
	UnaryExecutor::Execute<INPUT_TYPE, string_t>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) { return StringDecompress<INPUT_TYPE>(input, allocator); },
	    FunctionErrors::CANNOT_ERROR);
}